

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O0

void __thiscall gulcalc::outputmode1data(gulcalc *this,int event_id)

{
  pointer *this_00;
  float fVar1;
  int iVar2;
  rd_option rVar3;
  bool bVar4;
  double dVar5;
  bool bVar6;
  reference piVar7;
  reference pvVar8;
  size_type sVar9;
  const_reference pvVar10;
  size_type sVar11;
  double dVar12;
  reference pvVar13;
  reference pvVar14;
  reference pvVar15;
  reference pvVar16;
  float local_fc;
  undefined1 local_dc [8];
  probrec p;
  prob_mean pp;
  int bin_index;
  int max_bin_end;
  bool hit_rval0;
  bool hit_rval;
  OASIS_FLOAT last_prob_to;
  OASIS_FLOAT prob_to_max;
  OASIS_FLOAT rval0;
  OASIS_FLOAT rval;
  int k;
  unsigned_long_long s2;
  unsigned_long_long s1;
  int ridx0;
  int ridx;
  gulItemIDLoss gi;
  size_t i;
  float local_70;
  float fStack_6c;
  bool hasData;
  OASIS_FLOAT exposureValue;
  OASIS_FLOAT tiv;
  int j;
  undefined1 local_58 [8];
  vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
  gilv0;
  vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
  gilv;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_20;
  iterator cov_iter;
  int rnd_count;
  int event_id_local;
  gulcalc *this_local;
  
  cov_iter._M_current._4_4_ = event_id;
  cov_iter._M_current._0_4_ = getRands::rdxmax(this->rnd_);
  local_20._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(&this->mode1UsedCoverageIDs_);
  do {
    gilv.
    super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<int,_std::allocator<int>_>::end(&this->mode1UsedCoverageIDs_);
    bVar6 = __gnu_cxx::operator!=
                      (&local_20,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       &gilv.
                        super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar6) {
      clearmode1_data(this);
      return;
    }
    this_00 = &gilv0.
               super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::
    vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
    ::vector((vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
              *)this_00);
    std::
    vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
    ::vector((vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
              *)local_58);
    std::
    vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
    ::resize((vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
              *)this_00,(long)(this->samplesize_ + 1 + this->num_idx_));
    if (this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) {
      std::
      vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
      ::resize((vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                *)local_58,(long)(this->samplesize_ + 1 + this->num_idx_));
    }
    piVar7 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_20);
    iVar2 = *piVar7;
    fStack_6c = 0.0;
    local_70 = 0.0;
    pvVar8 = std::
             vector<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
             ::operator[](&this->mode1_stats_,(long)iVar2);
    sVar9 = std::vector<processrecData,_std::allocator<processrecData>_>::size(pvVar8);
    if (sVar9 != 0) {
      pvVar10 = std::vector<float,_std::allocator<float>_>::operator[](this->coverages_,(long)iVar2)
      ;
      fStack_6c = *pvVar10;
      pvVar8 = std::
               vector<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
               ::operator[](&this->mode1_stats_,(long)iVar2);
      sVar11 = std::vector<processrecData,_std::allocator<processrecData>_>::size(pvVar8);
      local_fc = (float)sVar11;
      local_70 = fStack_6c / local_fc;
    }
    gi.loss = 0.0;
    while( true ) {
      dVar5 = gi.loss;
      pvVar8 = std::
               vector<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
               ::operator[](&this->mode1_stats_,(long)iVar2);
      dVar12 = (double)std::vector<processrecData,_std::allocator<processrecData>_>::size(pvVar8);
      if ((ulong)dVar12 <= (ulong)dVar5) break;
      pvVar8 = std::
               vector<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
               ::operator[](&this->mode1_stats_,(long)iVar2);
      pvVar13 = std::vector<processrecData,_std::allocator<processrecData>_>::operator[]
                          (pvVar8,(size_type)gi.loss);
      ridx0 = pvVar13->item_id;
      pvVar8 = std::
               vector<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
               ::operator[](&this->mode1_stats_,(long)iVar2);
      pvVar13 = std::vector<processrecData,_std::allocator<processrecData>_>::operator[]
                          (pvVar8,(size_type)gi.loss);
      gi._0_8_ = (BADTYPE)pvVar13->max_loss;
      pvVar14 = std::
                vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                ::operator[]((vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                              *)&gilv0.
                                 super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (long)(this->num_idx_ + -5));
      std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>::push_back
                (pvVar14,(value_type *)&ridx0);
      if (this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) {
        pvVar14 = std::
                  vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                  ::operator[]((vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                                *)local_58,(long)(this->num_idx_ + -5));
        std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>::push_back
                  (pvVar14,(value_type *)&ridx0);
      }
      gi._0_8_ = (BADTYPE)local_70;
      pvVar14 = std::
                vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                ::operator[]((vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                              *)&gilv0.
                                 super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (long)(this->num_idx_ + -3));
      std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>::push_back
                (pvVar14,(value_type *)&ridx0);
      if (this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) {
        pvVar14 = std::
                  vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                  ::operator[]((vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                                *)local_58,(long)(this->num_idx_ + -3));
        std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>::push_back
                  (pvVar14,(value_type *)&ridx0);
      }
      pvVar8 = std::
               vector<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
               ::operator[](&this->mode1_stats_,(long)iVar2);
      pvVar13 = std::vector<processrecData,_std::allocator<processrecData>_>::operator[]
                          (pvVar8,(size_type)gi.loss);
      gi._0_8_ = (BADTYPE)pvVar13->std_dev;
      pvVar14 = std::
                vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                ::operator[]((vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                              *)&gilv0.
                                 super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (long)(this->num_idx_ + -2));
      std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>::push_back
                (pvVar14,(value_type *)&ridx0);
      if (this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) {
        pvVar14 = std::
                  vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                  ::operator[]((vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                                *)local_58,(long)(this->num_idx_ + -2));
        std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>::push_back
                  (pvVar14,(value_type *)&ridx0);
      }
      pvVar8 = std::
               vector<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
               ::operator[](&this->mode1_stats_,(long)iVar2);
      pvVar13 = std::vector<processrecData,_std::allocator<processrecData>_>::operator[]
                          (pvVar8,(size_type)gi.loss);
      gi._0_8_ = (BADTYPE)pvVar13->gul_mean;
      pvVar14 = std::
                vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                ::operator[]((vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                              *)&gilv0.
                                 super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (long)(this->num_idx_ + -1));
      std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>::push_back
                (pvVar14,(value_type *)&ridx0);
      if (this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) {
        pvVar14 = std::
                  vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                  ::operator[]((vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                                *)local_58,(long)(this->num_idx_ + -1));
        std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>::push_back
                  (pvVar14,(value_type *)&ridx0);
      }
      s1._4_4_ = 0;
      s1._0_4_ = 0;
      rVar3 = this->rndopt_;
      if (rVar3 == userandomnumberfile) {
        pvVar8 = std::
                 vector<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
                 ::operator[](&this->mode1_stats_,(long)iVar2);
        pvVar13 = std::vector<processrecData,_std::allocator<processrecData>_>::operator[]
                            (pvVar8,(size_type)gi.loss);
        s1._4_4_ = (int)(((long)pvVar13->group_id * this->p1_ * this->p3_ +
                         (long)cov_iter._M_current._4_4_ * this->p2_) %
                        (long)(int)cov_iter._M_current);
        s1._0_4_ = (int)((this->p1_ * this->p3_ + (long)cov_iter._M_current._4_4_ * this->p2_) %
                        (long)(int)cov_iter._M_current);
      }
      else if (rVar3 == usehashedseed) {
        pvVar8 = std::
                 vector<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
                 ::operator[](&this->mode1_stats_,(long)iVar2);
        pvVar13 = std::vector<processrecData,_std::allocator<processrecData>_>::operator[]
                            (pvVar8,(size_type)gi.loss);
        rval = (OASIS_FLOAT)(((long)cov_iter._M_current._4_4_ * 0x73d3fc6f) % 0x80000000);
        getRands::seedRands(this->rnd_,
                            pvVar13->group_id * 0x5bfc6fdb + (int)rval + this->rand_seed_ &
                            0x7fffffff);
        if (this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) {
          getRands::seedRands(this->rnd0_,(int)rval + this->rand_seed_ & 0x7fffffff);
        }
      }
      else {
        if (rVar3 != usecachedvector) {
          fprintf(_stderr,"FATAL: %s: Unknown random number option\n","outputmode1data");
          exit(-1);
        }
        pvVar8 = std::
                 vector<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
                 ::operator[](&this->mode1_stats_,(long)iVar2);
        pvVar13 = std::vector<processrecData,_std::allocator<processrecData>_>::operator[]
                            (pvVar8,(size_type)gi.loss);
        s1._4_4_ = pvVar13->group_id * this->samplesize_;
        s1._0_4_ = this->samplesize_;
      }
      for (rval0 = 0.0; (int)rval0 < this->samplesize_; rval0 = (OASIS_FLOAT)((int)rval0 + 1)) {
        last_prob_to = 0.0;
        if (this->rndopt_ == usehashedseed) {
          prob_to_max = getRands::nextrnd(this->rnd_);
          if (this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) {
            last_prob_to = getRands::nextrnd(this->rnd0_);
          }
        }
        else {
          prob_to_max = getRands::rnd(this->rnd_,s1._4_4_ + (int)rval0);
          if (this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) {
            last_prob_to = getRands::rnd(this->rnd0_,(int)s1 + (int)rval0);
          }
        }
        pvVar8 = std::
                 vector<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
                 ::operator[](&this->mode1_stats_,(long)iVar2);
        pvVar13 = std::vector<processrecData,_std::allocator<processrecData>_>::operator[]
                            (pvVar8,(size_type)gi.loss);
        pvVar15 = std::vector<int,_std::allocator<int>_>::back(&pvVar13->bin_map_ids);
        pvVar16 = std::vector<prob_mean,_std::allocator<prob_mean>_>::operator[]
                            (&this->bin_lookup_,(long)*pvVar15);
        fVar1 = pvVar16->prob_to;
        if (fVar1 <= prob_to_max) {
          prob_to_max = fVar1 - 3e-08;
        }
        if ((this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) &&
           (fVar1 <= last_prob_to)) {
          last_prob_to = fVar1 - 3e-08;
        }
        max_bin_end = 0;
        bVar6 = false;
        bVar4 = false;
        pvVar8 = std::
                 vector<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
                 ::operator[](&this->mode1_stats_,(long)iVar2);
        pvVar13 = std::vector<processrecData,_std::allocator<processrecData>_>::operator[]
                            (pvVar8,(size_type)gi.loss);
        sVar11 = std::vector<int,_std::allocator<int>_>::size(&pvVar13->bin_map_ids);
        for (pp.prob_to = 0.0; (int)pp.prob_to < (int)sVar11;
            pp.prob_to = (OASIS_FLOAT)((int)pp.prob_to + 1)) {
          pvVar8 = std::
                   vector<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
                   ::operator[](&this->mode1_stats_,(long)iVar2);
          pvVar13 = std::vector<processrecData,_std::allocator<processrecData>_>::operator[]
                              (pvVar8,(size_type)gi.loss);
          pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pvVar13->bin_map_ids,(long)(int)pp.prob_to);
          pvVar16 = std::vector<prob_mean,_std::allocator<prob_mean>_>::operator[]
                              (&this->bin_lookup_,(long)*pvVar15);
          p._4_8_ = *pvVar16;
          local_dc._0_4_ = max_bin_end;
          local_dc._4_4_ = p.prob_to;
          p.prob_from = p.bin_mean;
          max_bin_end = (int)p.prob_to;
          if ((prob_to_max < p.prob_to) && (!bVar6)) {
            fillgulitemloss(this,ridx0,fStack_6c,cov_iter._M_current._4_4_,(int)pp.prob_to,
                            prob_to_max,(probrec *)local_dc,(int)rval0 + 1,
                            (vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                             *)&gilv0.
                                super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
            if (this->correlatedWriter_ == (_func_void_void_ptr_int_int *)0x0) break;
            bVar6 = true;
          }
          if (((this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) &&
              (last_prob_to < (float)local_dc._4_4_)) && (!bVar4)) {
            fillgulitemloss(this,ridx0,fStack_6c,cov_iter._M_current._4_4_,(int)pp.prob_to,
                            last_prob_to,(probrec *)local_dc,(int)rval0 + 1,
                            (vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                             *)local_58);
            bVar4 = true;
          }
          if ((bVar6) && (bVar4)) break;
        }
      }
      gi.loss = (double)((long)gi.loss + 1);
    }
    if ((sVar9 != 0) &&
       (writemode1output(this,cov_iter._M_current._4_4_,fStack_6c,
                         (vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                          *)&gilv0.
                             super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,false),
       this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0)) {
      writemode1output(this,cov_iter._M_current._4_4_,fStack_6c,
                       (vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                        *)local_58,true);
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_20,0);
    std::
    vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
    ::~vector((vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
               *)local_58);
    std::
    vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
    ::~vector((vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
               *)&gilv0.
                  super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  } while( true );
}

Assistant:

void gulcalc::outputmode1data(int event_id) {

	int rnd_count = rnd_->rdxmax();

	auto cov_iter = mode1UsedCoverageIDs_.begin();
	while (cov_iter != mode1UsedCoverageIDs_.end()) {

		std::vector<std::vector<gulItemIDLoss>> gilv;
		std::vector<std::vector<gulItemIDLoss>> gilv0;
		gilv.resize(samplesize_ + num_idx_ + 1);
		if (correlatedWriter_) gilv0.resize(samplesize_ + num_idx_ + 1);
		int j = *cov_iter;
		OASIS_FLOAT tiv = 0.0;
		OASIS_FLOAT exposureValue = 0.0;
		bool hasData = false;
		if (mode1_stats_[j].size() > 0) {
			tiv = (*coverages_)[j];
			exposureValue = tiv / mode1_stats_[j].size();
			hasData = true;
		}

		for (size_t i = 0; i < mode1_stats_[j].size(); i++) {

			gulItemIDLoss gi;
			gi.item_id = mode1_stats_[j][i].item_id;

			// maximum loss
			gi.loss = mode1_stats_[j][i].max_loss;
			gilv[max_loss_idx + num_idx_].push_back(gi);
			if (correlatedWriter_)
				gilv0[max_loss_idx + num_idx_].push_back(gi);

			// exposure value record
			// tiv / count(tuple(event_id-coverage_id))
			gi.loss = exposureValue;
			gilv[tiv_idx + num_idx_].push_back(gi);
			if (correlatedWriter_)
				gilv0[tiv_idx + num_idx_].push_back(gi);

			// standard deviation
			gi.loss = mode1_stats_[j][i].std_dev;
			gilv[std_dev_idx + num_idx_].push_back(gi);
			if (correlatedWriter_)
				gilv0[std_dev_idx + num_idx_].push_back(gi);

			// mean
			gi.loss = mode1_stats_[j][i].gul_mean;
			gilv[mean_idx + num_idx_].push_back(gi);
			if (correlatedWriter_)
				gilv0[mean_idx + num_idx_].push_back(gi);

			int ridx = 0;
			int ridx0 = 0;
			switch (rndopt_) {
				case rd_option::userandomnumberfile:
					ridx = ((mode1_stats_[j][i].group_id * p1_ * p3_) + (event_id * p2_)) % rnd_count;
					ridx0 = ((p1_ * p3_) + (event_id * p2_)) % rnd_count;
					break;
				case rd_option::usecachedvector:
					ridx = mode1_stats_[j][i].group_id * samplesize_;
					ridx0 = samplesize_;
					break;
				case rd_option::usehashedseed:
				{
					unsigned long long s1 = (mode1_stats_[j][i].group_id * 1543270363L) % 2147483648L;   // hash group_id and event_id to seed random number
					unsigned long long s2 = (event_id * 1943272559L) % 2147483648L;
					s1 = (s1 + s2 + rand_seed_) % 2147483648L;
					rnd_->seedRands(s1);
					if (correlatedWriter_) {
						s2 = (s2 + rand_seed_) % 2147483648L;
						rnd0_->seedRands(s2);
					}
				}
				break;
				default:
					fprintf(stderr, "FATAL: %s: Unknown random number option\n", __func__);
					exit(-1);
			}

			// Generate losses for each sample
			for (int k = 0; k < samplesize_; k++) {

				OASIS_FLOAT rval;
				OASIS_FLOAT rval0 = 0;

				if (rndopt_ == rd_option::usehashedseed) {
					rval = rnd_->nextrnd();
					if (correlatedWriter_) rval0 = rnd0_->nextrnd();
				} else {
					rval = rnd_->rnd(ridx + k);
					if (correlatedWriter_) rval0 = rnd0_->rnd(ridx0 + k);
				}

				// If required set random number to just under
				// maximum prob_to (which should be 1)
				OASIS_FLOAT prob_to_max = bin_lookup_[mode1_stats_[j][i].bin_map_ids.back()].prob_to;
				if (rval >= prob_to_max) {
					rval = prob_to_max - 0.00000003;
				}
				if (correlatedWriter_ && rval0 >= prob_to_max) {
					rval0 = prob_to_max - 0.00000003;
				}

				OASIS_FLOAT last_prob_to = 0;
				bool hit_rval = false;
				bool hit_rval0 = false;
				int max_bin_end = (int)mode1_stats_[j][i].bin_map_ids.size();
				for (int bin_index = 0; bin_index < max_bin_end; bin_index++) {

					prob_mean pp = bin_lookup_[mode1_stats_[j][i].bin_map_ids[bin_index]];
					probrec p;
					p.prob_from = last_prob_to;
					p.prob_to = pp.prob_to;
					p.bin_mean = pp.bin_mean;
					last_prob_to = pp.prob_to;

					if (rval < p.prob_to && !hit_rval) {
						fillgulitemloss(gi.item_id, tiv, event_id, bin_index, rval, p, k+1, gilv);
						if (!correlatedWriter_) break;
						else hit_rval = true;
					}
					if (correlatedWriter_ && rval0 < p.prob_to && !hit_rval0) {
						fillgulitemloss(gi.item_id, tiv, event_id, bin_index, rval0, p, k+1, gilv0);
						hit_rval0 = true;
					}
					if (hit_rval && hit_rval0) break;

				}

			}

		}

		if (hasData) {

			writemode1output(event_id, tiv, gilv);
			if (correlatedWriter_) {
				writemode1output(event_id, tiv, gilv0, true);
			}

		}

		cov_iter++;

	}

	clearmode1_data();

}